

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

ArgumentMismatch * CLI::ArgumentMismatch::TypedAtLeast(string *name,int num,string *type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_c0 [12];
  int in_stack_ffffffffffffff4c;
  string local_a0 [8];
  string *in_stack_ffffffffffffff68;
  ArgumentMismatch *in_stack_ffffffffffffff70;
  string local_80 [32];
  string local_60 [32];
  string local_40 [64];
  
  __lhs = in_RDI;
  ::std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::to_string(in_stack_ffffffffffffff4c);
  ::std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  ::std::operator+(__lhs,(char *)in_RDI);
  ::std::operator+(__lhs,in_RDI);
  ::std::operator+(__lhs,(char *)in_RDI);
  ArgumentMismatch(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ::std::__cxx11::string::~string(local_40);
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string(local_a0);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  ::std::__cxx11::string::~string(local_c0);
  return (ArgumentMismatch *)__lhs;
}

Assistant:

static ArgumentMismatch TypedAtLeast(std::string name, int num, std::string type) {
        return ArgumentMismatch(name + ": " + std::to_string(num) + " required " + type + " missing");
    }